

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,Type type,string m_key_name,bool optional,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> inner,bool skip_type_check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  long lVar4;
  pointer pRVar5;
  undefined7 in_register_00000011;
  long *plVar6;
  long *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  
  plVar6 = (long *)CONCAT71(in_register_00000011,optional);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_type = type;
  paVar1 = &(this->m_key_name).field_2;
  (this->m_key_name)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar2) {
    lVar4 = plVar6[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(long *)((long)&(this->m_key_name).field_2 + 8) = lVar4;
  }
  else {
    (this->m_key_name)._M_dataplus._M_p = (pointer)*plVar6;
    (this->m_key_name).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_key_name)._M_string_length = plVar6[1];
  *plVar6 = (long)psVar2;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pRVar5 = (pointer)in_R9[1];
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*in_R9;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_R9[2];
  in_R9[2] = 0;
  *in_R9 = 0;
  in_R9[1] = 0;
  this->m_optional = skip_type_check;
  this->m_skip_type_check = m_key_name._M_dataplus._M_p._0_1_;
  paVar1 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(in_R8 + 2);
  if ((size_type *)*in_R8 == psVar2) {
    lVar4 = in_R8[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(long *)((long)&(this->m_description).field_2 + 8) = lVar4;
  }
  else {
    (this->m_description)._M_dataplus._M_p = (pointer)*in_R8;
    (this->m_description).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_description)._M_string_length = in_R8[1];
  *in_R8 = (long)psVar2;
  in_R8[1] = 0;
  *(undefined1 *)(in_R8 + 2) = 0;
  (this->m_cond)._M_dataplus._M_p = (pointer)&(this->m_cond).field_2;
  (this->m_cond)._M_string_length = 0;
  (this->m_cond).field_2._M_local_buf[0] = '\0';
  CheckInnerDoc(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        Type type,
        std::string m_key_name,
        bool optional,
        std::string description,
        std::vector<RPCResult> inner = {},
        bool skip_type_check = false)
        : m_type{std::move(type)},
          m_key_name{std::move(m_key_name)},
          m_inner{std::move(inner)},
          m_optional{optional},
          m_skip_type_check{skip_type_check},
          m_description{std::move(description)},
          m_cond{}
    {
        CheckInnerDoc();
    }